

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.h
# Opt level: O2

bool __thiscall QUuid::isNull(void *this)

{
  char *pcVar1;
  long lVar2;
  
  lVar2 = 8;
  while (lVar2 != 0x10) {
    pcVar1 = (char *)((long)this + lVar2);
    lVar2 = lVar2 + 1;
    if (*pcVar1 != '\0') {
      return false;
    }
  }
  if (*this != 0) {
    return false;
  }
  if (*(short *)((long)this + 4) != 0) {
    return false;
  }
  return *(short *)((long)this + 6) == 0;
}

Assistant:

constexpr bool isNull(QT6_DECL_NEW_OVERLOAD) const noexcept
    {
#if defined(__cpp_lib_bit_cast) && defined(QT_SUPPORTS_INT128)
        return std::bit_cast<quint128>(*this) == 0;
#else
        // QNX fails to compile
        // data4[0] == 0 && data4[1] == 0 && ...
        // in constexpr context, so rewrite it using a loop. This way we have
        // only single data4[i] != 0 check at each iteration
        for (size_t i = 0; i < 8; ++i) {
            if (data4[i] != 0)
                return false;
        }
        return data1 == 0 && data2 == 0 && data3 == 0;
#endif
    }